

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,ElementType v)

{
  ElementType v_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((int)this == 0) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"face");
  }
  else if ((int)this == 1) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"point");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::GeomSubset::ElementType v) {
  std::string s;

  switch (v) {
    case tinyusdz::GeomSubset::ElementType::Face: {
      s = "face";
      break;
    }
    case tinyusdz::GeomSubset::ElementType::Point: {
      s = "point";
      break;
    }
  }

  return s;
}